

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocalValue.h
# Opt level: O1

bool * __thiscall jbcoin::LocalValue<bool>::operator*(LocalValue<bool> *this)

{
  ulong uVar1;
  thread_specific_ptr<jbcoin::detail::LocalValues> *ptVar2;
  LocalValues *new_value;
  bool *pbVar3;
  long *plVar4;
  ulong uVar5;
  __node_base_ptr p_Var6;
  __node_base_ptr p_Var7;
  _Hash_node_base *p_Var8;
  pair<std::__detail::_Node_iterator<std::pair<const_void_*const,_std::unique_ptr<jbcoin::detail::LocalValues::BasicValue,_std::default_delete<jbcoin::detail::LocalValues::BasicValue>_>_>,_false,_false>,_bool>
  pVar9;
  LocalValue<bool> *local_28;
  
  ptVar2 = detail::getLocalValues<void>();
  new_value = (LocalValues *)boost::detail::get_tss_data(ptVar2);
  if (new_value == (LocalValues *)0x0) {
    new_value = (LocalValues *)operator_new(0x40);
    *(undefined8 *)new_value = 0;
    (new_value->values)._M_h._M_buckets = (__buckets_ptr)0x0;
    (new_value->values)._M_h._M_bucket_count = 0;
    (new_value->values)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    (new_value->values)._M_h._M_element_count = 0;
    *(undefined8 *)&(new_value->values)._M_h._M_rehash_policy = 0;
    (new_value->values)._M_h._M_rehash_policy._M_next_resize = 0;
    (new_value->values)._M_h._M_single_bucket = (__node_base_ptr)0x0;
    (new_value->values)._M_h._M_buckets = &(new_value->values)._M_h._M_single_bucket;
    (new_value->values)._M_h._M_bucket_count = 1;
    (new_value->values)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    (new_value->values)._M_h._M_element_count = 0;
    (new_value->values)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    new_value->onCoro = false;
    ptVar2 = detail::getLocalValues<void>();
    boost::thread_specific_ptr<jbcoin::detail::LocalValues>::reset(ptVar2,new_value);
  }
  else {
    uVar1 = (new_value->values)._M_h._M_bucket_count;
    uVar5 = (ulong)this % uVar1;
    p_Var6 = (new_value->values)._M_h._M_buckets[uVar5];
    p_Var7 = (__node_base_ptr)0x0;
    if ((p_Var6 != (__node_base_ptr)0x0) &&
       (p_Var8 = p_Var6->_M_nxt, p_Var7 = p_Var6,
       p_Var6->_M_nxt[1]._M_nxt != (_Hash_node_base *)this)) {
      while (p_Var6 = p_Var8, p_Var8 = p_Var6->_M_nxt, p_Var8 != (_Hash_node_base *)0x0) {
        p_Var7 = (__node_base_ptr)0x0;
        if (((ulong)p_Var8[1]._M_nxt % uVar1 != uVar5) ||
           (p_Var7 = p_Var6, p_Var8[1]._M_nxt == (_Hash_node_base *)this)) goto LAB_001e3e0f;
      }
      p_Var7 = (__node_base_ptr)0x0;
    }
LAB_001e3e0f:
    if (p_Var7 == (__node_base_ptr)0x0) {
      p_Var8 = (_Hash_node_base *)0x0;
    }
    else {
      p_Var8 = p_Var7->_M_nxt;
    }
    if (p_Var8 != (_Hash_node_base *)0x0) {
      pbVar3 = (bool *)(*(code *)(p_Var8[2]._M_nxt)->_M_nxt[2]._M_nxt)();
      return pbVar3;
    }
  }
  local_28 = this;
  plVar4 = (long *)operator_new(0x10);
  *plVar4 = (long)&PTR__BasicValue_002d8828;
  *(bool *)(plVar4 + 1) = this->t_;
  pVar9 = std::
          _Hashtable<void_const*,std::pair<void_const*const,std::unique_ptr<jbcoin::detail::LocalValues::BasicValue,std::default_delete<jbcoin::detail::LocalValues::BasicValue>>>,std::allocator<std::pair<void_const*const,std::unique_ptr<jbcoin::detail::LocalValues::BasicValue,std::default_delete<jbcoin::detail::LocalValues::BasicValue>>>>,std::__detail::_Select1st,std::equal_to<void_const*>,std::hash<void_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::
          _M_emplace<jbcoin::LocalValue<bool>*,std::unique_ptr<jbcoin::detail::LocalValues::Value<bool>,std::default_delete<jbcoin::detail::LocalValues::Value<bool>>>>
                    ((_Hashtable<void_const*,std::pair<void_const*const,std::unique_ptr<jbcoin::detail::LocalValues::BasicValue,std::default_delete<jbcoin::detail::LocalValues::BasicValue>>>,std::allocator<std::pair<void_const*const,std::unique_ptr<jbcoin::detail::LocalValues::BasicValue,std::default_delete<jbcoin::detail::LocalValues::BasicValue>>>>,std::__detail::_Select1st,std::equal_to<void_const*>,std::hash<void_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)&new_value->values,&local_28);
  pbVar3 = (bool *)(**(code **)(**(long **)((long)pVar9.first.
                                                  super__Node_iterator_base<std::pair<const_void_*const,_std::unique_ptr<jbcoin::detail::LocalValues::BasicValue,_std::default_delete<jbcoin::detail::LocalValues::BasicValue>_>_>,_false>
                                                  ._M_cur.
                                                  super__Node_iterator_base<std::pair<const_void_*const,_std::unique_ptr<jbcoin::detail::LocalValues::BasicValue,_std::default_delete<jbcoin::detail::LocalValues::BasicValue>_>_>,_false>
                                           + 0x10) + 0x10))();
  if (plVar4 != (long *)0x0) {
    (**(code **)(*plVar4 + 8))();
  }
  return pbVar3;
}

Assistant:

T&
LocalValue<T>::operator*()
{
    auto lvs = detail::getLocalValues().get();
    if (! lvs)
    {
        lvs = new detail::LocalValues();
        lvs->onCoro = false;
        detail::getLocalValues().reset(lvs);
    }
    else
    {
        auto const iter = lvs->values.find(this);
        if (iter != lvs->values.end())
            return *reinterpret_cast<T*>(iter->second->get());
    }

    return *reinterpret_cast<T*>(lvs->values.emplace(this,
        std::make_unique<detail::LocalValues::Value<T>>(t_)).
            first->second->get());
}